

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

Scene * __thiscall CMU462::DynamicScene::Scene::get_transformed_static_scene(Scene *this,double t)

{
  bool bVar1;
  int iVar2;
  reference ppSVar3;
  undefined4 extraout_var;
  reference ppSVar4;
  undefined4 extraout_var_00;
  Scene *pSVar5;
  vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
  *in_RDI;
  undefined8 in_XMM0_Qa;
  SceneLight *light;
  iterator __end2_1;
  iterator __begin2_1;
  set<CMU462::DynamicScene::SceneLight_*,_std::less<CMU462::DynamicScene::SceneLight_*>,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
  *__range2_1;
  SceneObject *staticObject;
  SceneObject *obj;
  iterator __end2;
  iterator __begin2;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *__range2;
  vector<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
  staticLights;
  vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
  staticObjects;
  set<CMU462::DynamicScene::SceneLight_*,_std::less<CMU462::DynamicScene::SceneLight_*>,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
  *in_stack_ffffffffffffff38;
  vector<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
  *in_stack_ffffffffffffff40;
  value_type *in_stack_ffffffffffffff48;
  vector<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
  *in_stack_ffffffffffffff50;
  Scene *in_stack_ffffffffffffff60;
  _Self local_90;
  _Self local_88;
  pointer *local_80;
  vector<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
  *local_68;
  SceneObject *local_60;
  _Self local_58;
  _Self local_50;
  pointer *local_48;
  undefined8 local_10;
  
  local_10 = in_XMM0_Qa;
  std::
  vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>::
  vector((vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
          *)0x20e6f2);
  std::vector<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
  ::vector((vector<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
            *)0x20e6ff);
  local_48 = &in_RDI[6].
              super__Vector_base<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_50._M_node =
       (_Base_ptr)
       std::
       set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
       ::begin((set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
                *)in_stack_ffffffffffffff38);
  local_58._M_node =
       (_Base_ptr)
       std::
       set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
       ::end((set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
              *)in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = std::operator!=(&local_50,&local_58);
    if (!bVar1) break;
    ppSVar3 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator*
                        ((_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*> *)
                         in_stack_ffffffffffffff40);
    local_60 = *ppSVar3;
    iVar2 = (*local_60->_vptr_SceneObject[8])(local_10);
    in_stack_ffffffffffffff50 =
         (vector<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
          *)CONCAT44(extraout_var,iVar2);
    local_68 = in_stack_ffffffffffffff50;
    if (in_stack_ffffffffffffff50 !=
        (vector<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
         *)0x0) {
      std::
      vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
      ::push_back((vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
                   *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
    std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator++
              ((_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*> *)
               in_stack_ffffffffffffff40);
  }
  local_80 = &in_RDI[8].
              super__Vector_base<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_88._M_node =
       (_Base_ptr)
       std::
       set<CMU462::DynamicScene::SceneLight_*,_std::less<CMU462::DynamicScene::SceneLight_*>,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
       ::begin(in_stack_ffffffffffffff38);
  local_90._M_node =
       (_Base_ptr)
       std::
       set<CMU462::DynamicScene::SceneLight_*,_std::less<CMU462::DynamicScene::SceneLight_*>,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
       ::end(in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = std::operator!=(&local_88,&local_90);
    if (!bVar1) break;
    ppSVar4 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneLight_*>::operator*
                        ((_Rb_tree_const_iterator<CMU462::DynamicScene::SceneLight_*> *)0x20e814);
    iVar2 = (**(*ppSVar4)->_vptr_SceneLight)();
    in_stack_ffffffffffffff60 = (Scene *)CONCAT44(extraout_var_00,iVar2);
    std::
    vector<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>::
    push_back(in_stack_ffffffffffffff40,(value_type *)in_stack_ffffffffffffff38);
    std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneLight_*>::operator++
              ((_Rb_tree_const_iterator<CMU462::DynamicScene::SceneLight_*> *)
               in_stack_ffffffffffffff40);
  }
  pSVar5 = (Scene *)operator_new(0x30);
  StaticScene::Scene::Scene(in_stack_ffffffffffffff60,in_RDI,in_stack_ffffffffffffff50);
  std::vector<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
  ::~vector(in_stack_ffffffffffffff50);
  std::
  vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>::
  ~vector((vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
           *)in_stack_ffffffffffffff50);
  return pSVar5;
}

Assistant:

StaticScene::Scene *Scene::get_transformed_static_scene(double t) {
  std::vector<StaticScene::SceneObject *> staticObjects;
  std::vector<StaticScene::SceneLight *> staticLights;

  for (SceneObject *obj : objects) {
    auto staticObject = obj->get_transformed_static_object(t);
    if (staticObject != nullptr) staticObjects.push_back(staticObject);
  }
  for (SceneLight *light : lights) {
    staticLights.push_back(light->get_static_light());
  }
  return new StaticScene::Scene(staticObjects, staticLights);
}